

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O0

bool __thiscall Clasp::DefaultUnfoundedCheck::findSource(DefaultUnfoundedCheck *this,NodeId headId)

{
  bool bVar1;
  uint32 uVar2;
  DefaultUnfoundedCheck *this_00;
  DefaultUnfoundedCheck *n;
  iterator puVar3;
  iterator puVar4;
  reference pAVar5;
  uint in_ESI;
  FILE *__stream;
  Solver *in_RDI;
  BodyPtr BVar6;
  iterator end;
  iterator it;
  uint32 visited;
  BodyPtr bodyNode;
  AtomNode *headNode;
  AtomData *head;
  uint32 newSource;
  NodeId *bodyEnd;
  NodeId *bodyIt;
  undefined4 in_stack_ffffffffffffff78;
  NodeId in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  BodyPtr *in_stack_ffffffffffffff90;
  BodyPtr *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  uint uVar7;
  undefined4 in_stack_ffffffffffffffb4;
  BodyNode *local_48;
  uint32 local_40;
  AtomNode *local_38;
  reference local_30;
  uint32 local_24;
  uint local_c;
  
  local_24 = 0;
  __stream = (FILE *)(ulong)in_ESI;
  local_c = in_ESI;
  pushUfs((DefaultUnfoundedCheck *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
          in_stack_ffffffffffffff7c);
  do {
    while( true ) {
      bVar1 = PodQueue<unsigned_int>::empty
                        ((PodQueue<unsigned_int> *)
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        PodQueue<unsigned_int>::rewind((PodQueue<unsigned_int> *)&(in_RDI->stats).multi,__stream);
        if (local_24 != 0) {
          uVar2 = sizeVec<bk_lib::pod_vector<unsigned_int,std::allocator<unsigned_int>>>
                            ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x2103d0);
          PodQueue<unsigned_int>::clear
                    ((PodQueue<unsigned_int> *)
                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
          if (uVar2 != local_24) {
            puVar3 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                               ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                &in_RDI->heuristic_);
            puVar4 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                &in_RDI->heuristic_);
            for (; puVar3 != puVar4; puVar3 = puVar3 + 1) {
              pAVar5 = bk_lib::
                       pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
                       ::operator[]((pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
                                     *)&in_RDI->stats,*puVar3);
              in_stack_ffffffffffffff84 = ((int)*pAVar5 >> 0x1f) + 1;
              pAVar5 = bk_lib::
                       pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
                       ::operator[]((pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
                                     *)&in_RDI->stats,*puVar3);
              *pAVar5 = (AtomData)
                        ((uint)*pAVar5 & 0xbfffffff | (in_stack_ffffffffffffff84 & 1) << 0x1e);
              if ((in_stack_ffffffffffffff84 & 1) == 1) {
                PodQueue<unsigned_int>::push
                          ((PodQueue<unsigned_int> *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           (uint *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
              }
            }
          }
        }
        bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
                  ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)&in_RDI->heuristic_);
        bVar1 = PodQueue<unsigned_int>::empty
                          ((PodQueue<unsigned_int> *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        return bVar1;
      }
      local_c = PodQueue<unsigned_int>::pop_ret((PodQueue<unsigned_int> *)0x210208);
      __stream = (FILE *)(ulong)local_c;
      local_30 = bk_lib::
                 pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
                 ::operator[]((pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
                               *)&in_RDI->stats,local_c);
      bVar1 = AtomData::hasSource(local_30);
      if (!bVar1) break;
      local_24 = local_24 + 1;
      *local_30 = (AtomData)((uint)*local_30 & 0xbfffffff);
    }
    __stream = (FILE *)(ulong)local_c;
    local_38 = Asp::PrgDepGraph::getAtom
                         ((PrgDepGraph *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff7c);
    this_00 = (DefaultUnfoundedCheck *)Asp::PrgDepGraph::AtomNode::bodies_begin(local_38);
    n = (DefaultUnfoundedCheck *)Asp::PrgDepGraph::AtomNode::bodies_end(local_38);
    for (; this_00 != n;
        this_00 = (DefaultUnfoundedCheck *)
                  ((long)&(this_00->super_PostPropagator).super_Constraint._vptr_Constraint + 4)) {
      BVar6 = getBody((DefaultUnfoundedCheck *)
                      CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      in_stack_ffffffffffffff7c);
      local_48 = BVar6.node;
      uVar2 = BVar6.id;
      uVar7 = (local_48->super_Node).lit.rep_;
      __stream = (FILE *)(ulong)uVar7;
      local_40 = uVar2;
      bVar1 = Solver::isFalse(in_RDI,(Literal)(uint32)((ulong)in_stack_ffffffffffffff90 >> 0x20));
      if (!bVar1) {
        if (((*(uint *)&(local_48->super_Node).field_0x4 & 0xfffffff) !=
             (*(uint *)&(local_38->super_Node).field_0x4 & 0xfffffff)) ||
           (bVar1 = isValidSource(this_00,(BodyPtr *)n), bVar1)) {
          *local_30 = (AtomData)((uint)*local_30 & 0xbfffffff);
          __stream = (FILE *)(ulong)local_c;
          setSource((DefaultUnfoundedCheck *)CONCAT44(uVar7,in_stack_ffffffffffffffa0),
                    (NodeId)((ulong)in_stack_ffffffffffffff98 >> 0x20),in_stack_ffffffffffffff90);
          propagateSource((DefaultUnfoundedCheck *)CONCAT44(in_stack_ffffffffffffffb4,uVar2));
          local_24 = local_24 + 1;
          break;
        }
        __stream = (FILE *)&local_48;
        addUnsourced((DefaultUnfoundedCheck *)CONCAT44(uVar7,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff98);
      }
    }
    bVar1 = AtomData::hasSource(local_30);
    if (!bVar1) {
      __stream = (FILE *)&stack0xfffffffffffffff4;
      bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 in_stack_ffffffffffffff90,(uint *)in_RDI);
    }
  } while( true );
}

Assistant:

bool DefaultUnfoundedCheck::findSource(NodeId headId) {
	assert(ufs_.empty() && invalidQ_.empty());
	const NodeId* bodyIt, *bodyEnd;
	uint32 newSource = 0;
	pushUfs(headId); // unfounded, unless we find a new source
	while (!ufs_.empty()) {
		headId         = ufs_.pop_ret(); // still marked and in vector!
		AtomData& head = atoms_[headId];
		if (!head.hasSource()) {
			const AtomNode& headNode = graph_->getAtom(headId);
			for (bodyIt = headNode.bodies_begin(), bodyEnd = headNode.bodies_end(); bodyIt != bodyEnd; ++bodyIt) {
				BodyPtr bodyNode(getBody(*bodyIt));
				if (!solver_->isFalse(bodyNode.node->lit)) {
					if (bodyNode.node->scc != headNode.scc || isValidSource(bodyNode)) {
						head.ufs = 0;               // found a new source,
						setSource(headId, bodyNode);// set the new source
						propagateSource();          // and propagate it forward
						++newSource;
						break;
					}
					else { addUnsourced(bodyNode); }
				}
			}
			if (!head.hasSource()) { // still no source - check again once we are done
				invalidQ_.push_back(headId);
			}
		}
		else {  // head has a source and is thus not unfounded
			++newSource;
			head.ufs = 0;
		}
	} // while unfounded_.emtpy() == false
	ufs_.rewind();
	if (newSource != 0) {
		// some atoms in unfounded_ have a new source
		// clear queue and check possible candidates for atoms that are still unfounded
		uint32 visited = sizeVec(ufs_.vec);
		ufs_.clear();
		if (visited != newSource) {
			// add elements that are still unfounded
			for (VarVec::iterator it = invalidQ_.begin(), end = invalidQ_.end(); it != end; ++it) {
				if ( (atoms_[*it].ufs = (1u - atoms_[*it].validS)) == 1 ) { ufs_.push(*it); }
			}
		}
	}
	invalidQ_.clear();
	return ufs_.empty();
}